

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void ColorPhiWeb(VmInstruction *inst,uint color)

{
  VmValue **ppVVar1;
  VmInstruction *pVVar2;
  VmInstruction *pVVar3;
  VmValueType VVar4;
  uint uVar5;
  VmValueType VVar6;
  VmInstruction *pVVar7;
  VmValue *pVVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (inst->color == 0) {
    inst->color = color;
    if ((inst->cmd == VM_INST_PHI) && ((inst->arguments).count != 0)) {
      uVar11 = 0;
      do {
        pVVar2 = (VmInstruction *)(inst->arguments).data[uVar11];
        if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
          pVVar2 = (VmInstruction *)0x0;
        }
        ColorPhiWeb(pVVar2,color);
        uVar10 = (int)uVar11 + 2;
        uVar11 = (ulong)uVar10;
      } while (uVar10 < (inst->arguments).count);
    }
    if (inst->cmd == VM_INST_MOV) {
      if ((inst->arguments).count == 0) {
LAB_001bcfec:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      pVVar2 = (VmInstruction *)*(inst->arguments).data;
      if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
        pVVar2 = (VmInstruction *)0x0;
      }
      ColorPhiWeb(pVVar2,color);
    }
    if ((inst->cmd == VM_INST_DEF) && ((inst->super_VmValue).users.count != 0)) {
      uVar11 = 0;
      do {
        pVVar8 = (inst->super_VmValue).users.data[uVar11];
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
          pVVar8 = (VmValue *)0x0;
        }
        if (((pVVar8 != (VmValue *)0x0) && (*(int *)&pVVar8[1]._vptr_VmValue == 0x51)) &&
           (VVar4 = pVVar8[1].type.type, VVar4 != VM_TYPE_VOID)) {
          uVar9 = 0;
          do {
            pVVar2 = *(VmInstruction **)(*(long *)&pVVar8[1].typeID + uVar9 * 8);
            if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
              pVVar2 = (VmInstruction *)0x0;
            }
            VVar6 = (int)uVar9 + VM_TYPE_INT;
            if (VVar4 <= VVar6) goto LAB_001bcfec;
            pVVar7 = *(VmInstruction **)(*(long *)&pVVar8[1].typeID + (ulong)VVar6 * 8);
            if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
              pVVar7 = (VmInstruction *)0x0;
            }
            if (pVVar2 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,6999,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar7 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,7000,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar2 == inst) {
              ColorPhiWeb(pVVar7,color);
            }
            VVar6 = (int)uVar9 + VM_TYPE_DOUBLE;
            uVar9 = (ulong)VVar6;
            VVar4 = pVVar8[1].type.type;
          } while (VVar6 < VVar4);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (inst->super_VmValue).users.count);
    }
    if ((inst->super_VmValue).users.count != 0) {
      uVar11 = 0;
      do {
        pVVar2 = (VmInstruction *)(inst->super_VmValue).users.data[uVar11];
        if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
          pVVar2 = (VmInstruction *)0x0;
        }
        if (pVVar2->cmd == VM_INST_PHI) {
          ColorPhiWeb(pVVar2,color);
        }
        if (pVVar2->cmd == VM_INST_MOV) {
          ColorPhiWeb(pVVar2,color);
        }
        if ((pVVar2->cmd == VM_INST_PARALLEL_COPY) &&
           (uVar10 = (pVVar2->arguments).count, uVar10 != 0)) {
          uVar9 = 0;
          do {
            ppVVar1 = (pVVar2->arguments).data;
            pVVar7 = (VmInstruction *)ppVVar1[uVar9];
            if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
              pVVar7 = (VmInstruction *)0x0;
            }
            uVar5 = (int)uVar9 + 1;
            if (uVar10 <= uVar5) goto LAB_001bcfec;
            pVVar3 = (VmInstruction *)ppVVar1[uVar5];
            if ((pVVar3 == (VmInstruction *)0x0) || ((pVVar3->super_VmValue).typeID != 2)) {
              pVVar3 = (VmInstruction *)0x0;
            }
            if (pVVar7 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1b72,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar3 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1b73,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar3 == inst) {
              ColorPhiWeb(pVVar7,color);
            }
            uVar5 = (int)uVar9 + 2;
            uVar9 = (ulong)uVar5;
            uVar10 = (pVVar2->arguments).count;
          } while (uVar5 < uVar10);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (inst->super_VmValue).users.count);
    }
  }
  return;
}

Assistant:

void ColorPhiWeb(VmInstruction *inst, unsigned color)
{
	if(inst->color != 0)
		return;

	inst->color = color;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			ColorPhiWeb(instruction, color);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		ColorPhiWeb(instruction, color);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						ColorPhiWeb(source, color);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_MOV)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					ColorPhiWeb(destination, color);
			}
		}
	}
}